

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O2

void __thiscall
TI::TMS::SMSFetcher<(TI::TMS::Personality)3>::SMSFetcher
          (SMSFetcher<(TI::TMS::Personality)3> *this,Base<(TI::TMS::Personality)3> *base,uint8_t y)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  AddressT AVar4;
  uint uVar5;
  ushort uVar6;
  undefined7 in_register_00000011;
  ushort uVar7;
  bool bVar8;
  
  this->base = base;
  this->storage = &base->super_Storage<(TI::TMS::Personality)3,_void>;
  this->y = y;
  if ((0xf < y) ||
     (uVar5 = 0,
     (base->super_Storage<(TI::TMS::Personality)3,_void>).horizontal_scroll_lock_ == false)) {
    uVar5 = (uint)(base->fetch_line_buffer_->latched_horizontal_scroll >> 3);
  }
  this->horizontal_offset = uVar5;
  bVar8 = (base->mode_timing_).pixel_lines == 0xc0;
  bVar1 = !bVar8;
  uVar7 = (base->super_Storage<(TI::TMS::Personality)3,_void>).pattern_name_address_;
  uVar3 = (uint)CONCAT71(in_register_00000011,y);
  uVar5 = ((uint)(base->super_Storage<(TI::TMS::Personality)3,_void>).latched_vertical_scroll_ +
           (uVar3 & 0xffff) & 0xffff) % ((uint)bVar1 * 0x20 + 0xe0);
  sVar2 = (ushort)bVar8 * 0x100;
  (this->scrolled_row_info).pattern_address_base =
       ((((ushort)uVar5 & 0xf8) * 8 - 0x800 & ((ushort)bVar1 << 0xb | uVar7)) + sVar2) - 0x100;
  uVar6 = (ushort)((uVar5 & 7) << 2);
  (this->scrolled_row_info).sub_row[0] = uVar6;
  (this->scrolled_row_info).sub_row[1] = uVar6 ^ 0x1c;
  if ((base->super_Storage<(TI::TMS::Personality)3,_void>).vertical_scroll_lock_ == true) {
    (this->static_row_info).pattern_address_base =
         (sVar2 + (uVar7 & (short)CONCAT71(in_register_00000011,y) * 8 & 0xffc0)) - 0x900;
    uVar7 = (ushort)((uVar3 & 7) << 2);
    (this->static_row_info).sub_row[0] = uVar7;
    (this->static_row_info).sub_row[1] = uVar7 ^ 0x1c;
    return;
  }
  (this->static_row_info).sub_row[1] = (this->scrolled_row_info).sub_row[1];
  AVar4 = (this->scrolled_row_info).sub_row[0];
  (this->static_row_info).pattern_address_base = (this->scrolled_row_info).pattern_address_base;
  (this->static_row_info).sub_row[0] = AVar4;
  return;
}

Assistant:

SMSFetcher(Base<personality> *base, uint8_t y) :
		base(base),
		storage(static_cast<Storage<personality> *>(base)),
		y(y),
		horizontal_offset((y >= 16 || !storage->horizontal_scroll_lock_) ? (base->fetch_line_buffer_->latched_horizontal_scroll >> 3) : 0)
	{
		// Limit address bits in use if this is a SMS2 mode.
		const bool is_tall_mode = base->mode_timing_.pixel_lines != 192;
		const AddressT pattern_name_address = storage->pattern_name_address_ | (is_tall_mode ? 0x800 : 0);
		const AddressT pattern_name_offset = is_tall_mode ? 0x100 : 0;

		// Determine row info for the screen both (i) if vertical scrolling is applied; and (ii) if it isn't.
		// The programmer can opt out of applying vertical scrolling to the right-hand portion of the display.
		const int scrolled_row = (y + storage->latched_vertical_scroll_) % (is_tall_mode ? 256 : 224);
		scrolled_row_info.pattern_address_base = (pattern_name_address & bits<11>(AddressT((scrolled_row & ~7) << 3))) - pattern_name_offset;
		scrolled_row_info.sub_row[0] = AddressT((scrolled_row & 7) << 2);
		scrolled_row_info.sub_row[1] = AddressT(28 ^ ((scrolled_row & 7) << 2));
		if(storage->vertical_scroll_lock_) {
			static_row_info.pattern_address_base = bits<11>(AddressT(pattern_name_address & ((y & ~7) << 3))) - pattern_name_offset;
			static_row_info.sub_row[0] = AddressT((y & 7) << 2);
			static_row_info.sub_row[1] = 28 ^ AddressT((y & 7) << 2);
		} else static_row_info = scrolled_row_info;
	}